

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

void __thiscall GlobOpt::EmitIntRangeChecks(GlobOpt *this,Instr *instr,Opnd *opnd)

{
  bool bVar1;
  int32 bound;
  int32 bound_00;
  IndirOpnd *pIVar2;
  StackSym *this_00;
  GlobOptBlockData *this_01;
  Value *pVVar3;
  IntBoundedValueInfo *pIVar4;
  IntRangeValueInfo *pIVar5;
  undefined1 local_38 [8];
  Instr *instr_local;
  RegOpnd *regOpnd;
  anon_class_16_2_c0c38448 EmitBoundCheck;
  
  if (((opnd != (Opnd *)0x0) &&
      ((local_38 = (undefined1  [8])instr, bVar1 = IR::Opnd::IsRegOpnd(opnd), bVar1 ||
       (bVar1 = IR::Opnd::IsIndirOpnd(opnd), bVar1)))) &&
     ((bVar1 = IR::Opnd::IsIndirOpnd(opnd), !bVar1 ||
      (pIVar2 = IR::Opnd::AsIndirOpnd(opnd), pIVar2->m_indexOpnd != (RegOpnd *)0x0)))) {
    bVar1 = IR::Opnd::IsRegOpnd(opnd);
    if (bVar1) {
      instr_local = (Instr *)IR::Opnd::AsRegOpnd(opnd);
    }
    else {
      pIVar2 = IR::Opnd::AsIndirOpnd(opnd);
      instr_local = (Instr *)pIVar2->m_indexOpnd;
    }
    if ((instr_local->field_0xa | TyInt64) == TyUint32) {
      this_00 = IR::Opnd::GetStackSym((Opnd *)instr_local);
      if ((this_00->field_0x1a & 1) != 0) {
        this_00 = StackSym::GetVarEquivSym_NoCreate(this_00);
      }
      this_01 = CurrentBlockData(this);
      pVVar3 = GlobOptBlockData::FindValue(this_01,&this_00->super_Sym);
      if (pVVar3 != (Value *)0x0) {
        bVar1 = ValueInfo::IsIntBounded(pVVar3->valueInfo);
        if (bVar1) {
          pIVar4 = ValueInfo::AsIntBounded(pVVar3->valueInfo);
          bound = IntBounds::ConstantLowerBound(pIVar4->bounds);
          pIVar4 = ValueInfo::AsIntBounded(pVVar3->valueInfo);
          bound_00 = IntBounds::ConstantUpperBound(pIVar4->bounds);
        }
        else {
          bVar1 = ValueInfo::IsIntRange(pVVar3->valueInfo);
          if (!bVar1) {
            return;
          }
          pIVar5 = ValueInfo::AsIntRange(pVVar3->valueInfo);
          bound = (pIVar5->super_IntConstantBounds).lowerBound;
          pIVar5 = ValueInfo::AsIntRange(pVVar3->valueInfo);
          bound_00 = (pIVar5->super_IntConstantBounds).upperBound;
        }
        regOpnd = (RegOpnd *)local_38;
        EmitBoundCheck.instr = &instr_local;
        EmitIntRangeChecks::anon_class_16_2_c0c38448::operator()
                  ((anon_class_16_2_c0c38448 *)&regOpnd,CheckLowerIntBound,bound);
        if (bound_00 != 0x7fffffff) {
          EmitIntRangeChecks::anon_class_16_2_c0c38448::operator()
                    ((anon_class_16_2_c0c38448 *)&regOpnd,CheckUpperIntBound,bound_00);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::EmitIntRangeChecks(IR::Instr* instr, IR::Opnd* opnd)
{
    if (!opnd || 
        (!opnd->IsRegOpnd() && !opnd->IsIndirOpnd()) ||
        (opnd->IsIndirOpnd() && !opnd->AsIndirOpnd()->GetIndexOpnd()))
    {
        return;
    }

    IR::RegOpnd * regOpnd = opnd->IsRegOpnd() ? opnd->AsRegOpnd() : opnd->AsIndirOpnd()->GetIndexOpnd();
    if (!(regOpnd->IsInt32() || regOpnd->IsUInt32()))
    {
        return;
    }
    
    StackSym * sym = regOpnd->GetStackSym();
    if (sym->IsTypeSpec())
    {
        sym = sym->GetVarEquivSym_NoCreate();
    }
    
    Value * value = CurrentBlockData()->FindValue(sym);

    if (!value)
    {
        return;
    }

    int32 lowerBound = INT_MIN;
    int32 upperBound = INT_MAX;
    
    if (value->GetValueInfo()->IsIntBounded())
    {
        lowerBound = value->GetValueInfo()->AsIntBounded()->Bounds()->ConstantLowerBound();
        upperBound = value->GetValueInfo()->AsIntBounded()->Bounds()->ConstantUpperBound();
    }
    else if (value->GetValueInfo()->IsIntRange())
    {
        lowerBound = value->GetValueInfo()->AsIntRange()->LowerBound();
        upperBound = value->GetValueInfo()->AsIntRange()->UpperBound();
    }
    else
    {
        return;
    }

    const auto EmitBoundCheck = [&](Js::OpCode opcode, int32 bound)
    {
        IR::Opnd * boundOpnd = IR::IntConstOpnd::New(bound, TyInt32, instr->m_func, true /*dontEncode*/);
        IR::Instr * boundCheckInstr = IR::Instr::New(opcode, instr->m_func);
        boundCheckInstr->SetSrc1(regOpnd);
        boundCheckInstr->SetSrc2(boundOpnd);
        instr->InsertBefore(boundCheckInstr);
    };

    if (lowerBound > INT_MIN)
    {
        EmitBoundCheck(Js::OpCode::CheckLowerIntBound, lowerBound);
    }
    if (upperBound < INT_MAX)
    {
        EmitBoundCheck(Js::OpCode::CheckUpperIntBound, upperBound);
    }
}